

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

void __thiscall
duckdb::ClientContext::ClientContext
          (ClientContext *this,shared_ptr<duckdb::DatabaseInstance,_true> *database)

{
  _Head_base<0UL,_duckdb::Logger_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ClientData_*,_false> this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  LoggingContext context;
  _Head_base<0UL,_duckdb::Logger_*,_false> _Var4;
  pointer __p;
  DatabaseInstance *pDVar5;
  type pLVar6;
  _Head_base<0UL,_duckdb::ClientData_*,_false> this_01;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Logger_*,_false> local_88;
  undefined1 local_80;
  undefined1 uStack_78;
  undefined7 uStack_77;
  undefined1 uStack_70;
  undefined7 uStack_6f;
  undefined1 uStack_68;
  undefined7 uStack_67;
  undefined1 uStack_60;
  undefined7 uStack_5f;
  undefined7 uStack_57;
  bool local_50;
  LogMode LStack_4f;
  LogLevel LStack_4e;
  undefined1 uStack_4d;
  undefined4 uStack_4c;
  char cStack_48;
  undefined3 uStack_47;
  undefined4 uStack_44;
  char local_40;
  undefined3 uStack_3f;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  (this->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> =
       (__weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>)0x0;
  (this->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (database->internal).
           super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (database->internal).
           super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (database->internal).super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  (this->db).internal.super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  (database->internal).super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->interrupted)._M_base._M_i = false;
  this->registered_state =
       (unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
        )0x0;
  this->logger = (unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>)0x0;
  ClientConfig::ClientConfig(&this->config);
  (this->client_data).super_unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>
  ._M_t.super___uniq_ptr_impl<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ClientData_*,_std::default_delete<duckdb::ClientData>_>.
  super__Head_base<0UL,_duckdb::ClientData_*,_false>._M_head_impl = (ClientData *)0x0;
  TransactionContext::TransactionContext(&this->transaction,this);
  *(undefined1 (*) [16])&(this->context_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])((long)&(this->context_lock).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(this->context_lock).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  QueryProgress::QueryProgress(&this->query_progress);
  this->connection_id = 0xffffffffffffffff;
  __p = (pointer)operator_new(0x60);
  *(undefined1 (*) [16])&(__p->lock).super___mutex_base._M_mutex.__data.__list.__next =
       (undefined1  [16])0x0;
  (__p->registered_state)._M_h._M_bucket_count = 0;
  (__p->registered_state)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (__p->registered_state)._M_h._M_element_count = 0;
  (__p->registered_state)._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  *(undefined4 *)&(__p->registered_state)._M_h._M_rehash_policy.field_0x4 = 0;
  *(undefined1 (*) [16])((long)&(__p->lock).super___mutex_base._M_mutex + 0x10) =
       (undefined1  [16])0x0;
  *(undefined1 (*) [16])&(__p->lock).super___mutex_base._M_mutex = (undefined1  [16])0x0;
  (__p->registered_state)._M_h._M_buckets = &(__p->registered_state)._M_h._M_single_bucket;
  (__p->registered_state)._M_h._M_bucket_count = 1;
  (__p->registered_state)._M_h._M_before_begin = (_Hash_node_base *)0x0;
  (__p->registered_state)._M_h._M_element_count = 0;
  (__p->registered_state)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  *(undefined1 (*) [16])&(__p->registered_state)._M_h._M_rehash_policy._M_next_resize =
       (undefined1  [16])0x0;
  ::std::
  __uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
  ::reset((__uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
           *)&this->registered_state,__p);
  _local_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  uStack_38 = 0xffffffff;
  uStack_34 = 0xffffffff;
  local_50 = true;
  LStack_4f = ~LEVEL_ONLY;
  LStack_4e = 0xff;
  uStack_4d = 0xff;
  uStack_4c = 0xffffffff;
  _cStack_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  pDVar5 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(&this->db);
  pLVar6 = shared_ptr<duckdb::LogManager,_true>::operator*(&pDVar5->log_manager);
  local_80 = 0x14;
  uStack_77 = CONCAT43(uStack_4c,_LStack_4f);
  uStack_6f = CONCAT43(uStack_44,uStack_47);
  uStack_67 = CONCAT43(uStack_3c,uStack_3f);
  uStack_78 = local_50;
  uStack_70 = cStack_48;
  uStack_68 = local_40;
  uStack_60 = (undefined1)uStack_38;
  uStack_5f = (undefined7)(CONCAT44(uStack_34,uStack_38) >> 8);
  context.query_id.index._1_7_ = uStack_5f;
  context.query_id.index._0_1_ = uStack_60;
  context._1_7_ = uStack_57;
  context.scope = 0x14;
  context.thread_id.index._1_7_ = uStack_77;
  context.thread_id.index._0_1_ = local_50;
  context.connection_id.index._1_7_ = uStack_6f;
  context.connection_id.index._0_1_ = cStack_48;
  context.transaction_id.index._1_7_ = uStack_67;
  context.transaction_id.index._0_1_ = local_40;
  LogManager::CreateLogger((LogManager *)&stack0xffffffffffffff78,context,SUB81(pLVar6,0),true);
  _Var4._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (Logger *)0x0;
  _Var1._M_head_impl =
       (this->logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
       super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
       super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl;
  (this->logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
  super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl = _Var4._M_head_impl;
  if (_Var1._M_head_impl != (Logger *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_Logger + 8))();
    if ((element_type *)local_88._M_head_impl != (element_type *)0x0) {
      (*(code *)((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                ((long)&(((((element_type *)local_88._M_head_impl)->
                          super_enable_shared_from_this<duckdb::LogManager>).__weak_this_.internal.
                          super___weak_ptr<duckdb::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        super_enable_shared_from_this<duckdb::LogManager>).__weak_this_ + 8))->_M_pi
      )();
    }
  }
  this_01._M_head_impl = (ClientData *)operator_new(0xc0);
  ClientData::ClientData(this_01._M_head_impl,this);
  this_00._M_head_impl =
       (this->client_data).
       super_unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>._M_t.
       super___uniq_ptr_impl<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::ClientData_*,_std::default_delete<duckdb::ClientData>_>.
       super__Head_base<0UL,_duckdb::ClientData_*,_false>._M_head_impl;
  (this->client_data).super_unique_ptr<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>
  ._M_t.super___uniq_ptr_impl<duckdb::ClientData,_std::default_delete<duckdb::ClientData>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ClientData_*,_std::default_delete<duckdb::ClientData>_>.
  super__Head_base<0UL,_duckdb::ClientData_*,_false>._M_head_impl = this_01._M_head_impl;
  if (this_00._M_head_impl != (ClientData *)0x0) {
    ClientData::~ClientData(this_00._M_head_impl);
    operator_delete(this_00._M_head_impl);
  }
  return;
}

Assistant:

ClientContext::ClientContext(shared_ptr<DatabaseInstance> database)
    : db(std::move(database)), interrupted(false), transaction(*this), connection_id(DConstants::INVALID_INDEX) {
	registered_state = make_uniq<RegisteredStateManager>();
#ifdef DEBUG
	registered_state->GetOrCreate<DebugClientContextState>("debug_client_context_state");
#endif
	LoggingContext context(LogContextScope::CONNECTION);
	logger = db->GetLogManager().CreateLogger(context, true);
	client_data = make_uniq<ClientData>(*this);
}